

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O1

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
multiplicativeExpression(Tokenizer *tokenizer)

{
  TokenType TVar1;
  bool bVar2;
  _Head_base<0UL,_ExpressionInternal_*,_false> __p;
  Token *pTVar3;
  ExpressionInternal *this;
  OperatorType op;
  Tokenizer *in_RSI;
  char cVar4;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp2;
  undefined1 local_58 [16];
  _Head_base<0UL,_ExpressionInternal_*,_false> local_48;
  __uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_40;
  _Head_base<0UL,_ExpressionInternal_*,_false> local_38;
  
  unaryExpression((Tokenizer *)local_58);
  if ((ExpressionInternal *)local_58._0_8_ == (ExpressionInternal *)0x0) {
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
  }
  else {
    do {
      pTVar3 = Tokenizer::peekToken(in_RSI,0);
      TVar1 = pTVar3->type;
      if (TVar1 == Mult) {
        op = Mult;
LAB_00144ea3:
        bVar2 = false;
      }
      else {
        if (TVar1 == Div) {
          op = Div;
          goto LAB_00144ea3;
        }
        if (TVar1 == Mod) {
          op = Mod;
          goto LAB_00144ea3;
        }
        op = Invalid;
        bVar2 = true;
      }
      cVar4 = '\x03';
      if (!bVar2) {
        Tokenizer::eatTokens(in_RSI,1);
        unaryExpression((Tokenizer *)(local_58 + 8));
        cVar4 = (_List_node_base *)local_58._8_8_ == (_List_node_base *)0x0;
        if ((bool)cVar4) {
          (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)0x0;
        }
        else {
          this = (ExpressionInternal *)operator_new(0x50);
          local_38._M_head_impl = (ExpressionInternal *)local_58._0_8_;
          local_58._0_8_ =
               (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0
          ;
          local_40._M_t.
          super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
          super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
               (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
               (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)local_58._8_8_
          ;
          local_58._8_8_ = (_List_node_base *)0x0;
          ExpressionInternal::
          ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                    (this,op,(unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                              *)&local_38,
                     (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     &local_40);
          local_48._M_head_impl = this;
          std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                    ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     &local_40);
          std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                    ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     &local_38);
          __p._M_head_impl = local_48._M_head_impl;
          local_48._M_head_impl = (ExpressionInternal *)0x0;
          std::__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::reset
                    ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                      *)local_58,__p._M_head_impl);
          std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                    ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     &local_48);
        }
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_58 + 8));
      }
    } while (cVar4 == '\0');
    if (cVar4 == '\x03') {
      (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)local_58._0_8_;
      local_58._0_8_ = (ExpressionInternal *)0x0;
    }
  }
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_58);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> multiplicativeExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = unaryExpression(tokenizer);
	if (exp ==  nullptr)
		return nullptr;

	while (true)
	{
		OperatorType op = OperatorType::Invalid;
		switch (tokenizer.peekToken().type)
		{
		case TokenType::Mult:
			op = OperatorType::Mult;
			break;
		case TokenType::Div:
			op = OperatorType::Div;
			break;
		case TokenType::Mod:
			op = OperatorType::Mod;
			break;
		default:
			break;
		}

		if (op == OperatorType::Invalid)
			break;

		tokenizer.eatToken();

		std::unique_ptr<ExpressionInternal> exp2 = unaryExpression(tokenizer);
		if (exp2 == nullptr)
			return nullptr;

		exp = std::make_unique<ExpressionInternal>(op, std::move(exp), std::move(exp2));
	}

	return exp;
}